

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_ht_test.cpp
# Opt level: O2

int main(void)

{
  ulong uVar1;
  result_type rVar2;
  undefined8 uVar3;
  ostream *poVar4;
  int iVar5;
  unsigned_long *i_1;
  pointer puVar6;
  unsigned_long *i_4;
  pointer puVar7;
  unsigned_long *i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> keys;
  uniform_int_distribution<unsigned_long> dis;
  default_random_engine en;
  BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>
  bht;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_900;
  unsigned_long local_8e8;
  undefined8 local_8e0;
  undefined8 local_8d8;
  undefined8 local_8d0;
  undefined8 local_8c8;
  uniform_int_distribution<unsigned_long> local_8c0;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_8b0;
  BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>
  local_8a8;
  
  local_8a8.root_node_.super_node.type_ = false;
  local_8a8.root_node_._1_7_ = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_900,10000000,
             (value_type_conflict *)&local_8a8,(allocator_type *)&local_8c0);
  neatlib::
  BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>
  ::BasicHashTable(&local_8a8);
  uVar1 = std::chrono::_V2::steady_clock::now();
  puVar7 = local_900._M_impl.super__Vector_impl_data._M_finish;
  iVar5 = (int)((uVar1 & 0xffffffff) % 0x7fffffff);
  local_8b0._M_x = (unsigned_long)(iVar5 + (uint)(iVar5 == 0));
  local_8c0._M_param._M_a = 0;
  local_8c0._M_param._M_b = 20000000;
  for (puVar6 = local_900._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar7;
      puVar6 = puVar6 + 1) {
    rVar2 = std::uniform_int_distribution<unsigned_long>::operator()(&local_8c0,&local_8b0);
    *puVar6 = rVar2;
  }
  uVar3 = std::chrono::_V2::steady_clock::now();
  puVar7 = local_900._M_impl.super__Vector_impl_data._M_finish;
  for (puVar6 = local_900._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar7;
      puVar6 = puVar6 + 1) {
    local_8e8 = 10;
    neatlib::
    BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>
    ::Insert(&local_8a8,puVar6,&local_8e8);
  }
  local_8d0 = std::chrono::_V2::steady_clock::now();
  puVar7 = local_900._M_impl.super__Vector_impl_data._M_finish;
  for (puVar6 = local_900._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar7;
      puVar6 = puVar6 + 1) {
    neatlib::
    BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>
    ::Get(&local_8a8,puVar6);
  }
  local_8c8 = uVar3;
  local_8d8 = std::chrono::_V2::steady_clock::now();
  puVar7 = local_900._M_impl.super__Vector_impl_data._M_finish;
  for (puVar6 = local_900._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar7;
      puVar6 = puVar6 + 1) {
    local_8e8 = 0x14;
    neatlib::
    BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>
    ::Update(&local_8a8,puVar6,&local_8e8);
  }
  local_8e0 = std::chrono::_V2::steady_clock::now();
  for (puVar7 = local_900._M_impl.super__Vector_impl_data._M_start;
      puVar7 != local_900._M_impl.super__Vector_impl_data._M_finish; puVar7 = puVar7 + 1) {
    neatlib::
    BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>
    ::Remove(&local_8a8,puVar7);
  }
  std::chrono::_V2::steady_clock::now();
  poVar4 = std::operator<<((ostream *)&std::cout,"INSERTION TIME: ");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"GETTING TIME:   ");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  poVar4 = std::operator<<(poVar4,"  ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"UPDATING TIME:  ");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  poVar4 = std::operator<<(poVar4,"  ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"REMOVING TIME:  ");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  poVar4 = std::operator<<(poVar4,"  ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4,"  ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  neatlib::
  BasicHashTable<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_8UL>
  ::~BasicHashTable(&local_8a8);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_900);
  return 0;
}

Assistant:

int main() {
    vector<size_t> keys(TOTAL_ELEMENTS, 0);
    neatlib::BasicHashTable<size_t,
                              size_t,
                              std::hash<size_t>,
                              std::equal_to<size_t>,
                              std::allocator<std::pair<const size_t, size_t>>,
                              8> bht;
    default_random_engine en(static_cast<unsigned int>(steady_clock::now().time_since_epoch().count()));
    uniform_int_distribution<size_t> dis(0, RANGE);
    std::size_t right = 0, right2 = 0, right3 = 0;
    for (auto &i : keys) i = dis(en);

    auto t1 = steady_clock::now();
    for (const auto &i : keys)
        bht.Insert(i, 10);
    auto t2 = steady_clock::now();

    for (const auto &i : keys)
        if (bht.Get(i).second == 10)
            ++right;

    auto t3 = steady_clock::now();

    for (const auto &i : keys)
        if (bht.Update(i, 20))
            ++right2;
    auto t4 = steady_clock::now();

    for (const auto &i : keys)
        if (bht.Remove(i))
            ++right3;

    auto t5 = steady_clock::now();

    cout << "INSERTION TIME: " << duration_cast<milliseconds>(t2 - t1).count() << endl;
    cout << "GETTING TIME:   " << duration_cast<milliseconds>(t3 - t2).count() << "  " << right << endl;
    cout << "UPDATING TIME:  " << duration_cast<milliseconds>(t4 - t3).count() << "  " << right2 << endl;
    cout << "REMOVING TIME:  " << duration_cast<milliseconds>(t5 - t4).count() << "  " << bht.Size() << "  "
         << right3 << endl;

}